

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::BinaryAtomicOperationCase::ReturnValueVerifier::operator()
          (ReturnValueVerifier *this,TestLog *log,ConstPixelBufferAccess *resultSlice,
          int sliceOrFaceNdx)

{
  ChannelType CVar1;
  AtomicOperation AVar2;
  bool bVar3;
  bool bVar4;
  long *plVar5;
  char *__s;
  undefined8 *puVar6;
  int iVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  size_type *psVar9;
  ConstPixelBufferAccess *__n;
  void *__buf;
  Vector<int,_2> (*arr) [5];
  float (*arr_00) [5];
  Vector<int,_3> (*arr_01) [5];
  float (*arr_02) [5];
  int i;
  long lVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  int *piVar14;
  uint y;
  int iVar15;
  bool bVar16;
  float valueSoFar;
  IVec2 pixelCoords [5];
  IntFloatArr atomicArgs;
  IntFloatArr returnValues;
  IVec3 invocationGlobalIDs [5];
  allocator<char> local_619;
  int local_618;
  int local_614;
  string local_610;
  ConstPixelBufferAccess *local_5f0;
  int local_5e4;
  TestLog *local_5e0;
  long *local_5d8 [2];
  long local_5c8 [2];
  string local_5b8;
  undefined8 local_598;
  string local_588;
  string local_568;
  Functional local_548 [20];
  Functional local_534 [20];
  string local_520;
  ulong local_500;
  long *local_4f8;
  int aiStack_4f0 [2];
  long local_4e8 [3];
  undefined4 uStack_4d0;
  undefined4 local_4cc;
  undefined4 uStack_4c8;
  undefined8 uStack_4c4;
  undefined1 local_4b0 [8];
  undefined1 local_4a8 [112];
  ios_base local_438 [264];
  undefined1 local_330 [8];
  _func_int **local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320 [6];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [24];
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  CVar1 = (resultSlice->m_format).type;
  if ((0x21 < (ulong)CVar1) || (bVar16 = true, (0x2c0000000U >> ((ulong)CVar1 & 0x3f) & 1) == 0)) {
    bVar16 = CVar1 - SIGNED_INT8 < 3;
  }
  iVar7 = (resultSlice->m_size).m_data[0];
  local_618 = (resultSlice->m_size).m_data[1];
  local_5f0 = resultSlice;
  local_5e0 = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
  std::ostream::operator<<((ostringstream *)local_4b0,sliceOrFaceNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
  std::ios_base::~ios_base((ios_base *)(local_4a8 + 0x68));
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_4f8,0,(char *)0x0,0x1c92c0b);
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar8) {
    local_320[0]._0_8_ = paVar8->_M_allocated_capacity;
    local_320[0]._8_8_ = plVar5[3];
    local_330 = (undefined1  [8])local_320;
  }
  else {
    local_320[0]._0_8_ = paVar8->_M_allocated_capacity;
    local_330 = (undefined1  [8])*plVar5;
  }
  local_328 = (_func_int **)plVar5[1];
  *plVar5 = (long)paVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (this->m_imageType == TEXTURETYPE_CUBE) {
    __s = glu::getCubeMapFaceName
                    ((&DAT_01c91b3c)
                     [(int)(&Functional::(anonymous_namespace)::glslImageFuncZToCubeFace(int)::faces
                           )[sliceOrFaceNdx]]);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_5d8,__s,&local_619);
    puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)local_5d8,0,(char *)0x0,0x1cfa86a);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
    std::ostream::operator<<(local_4b0,sliceOrFaceNdx);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
    std::ios_base::~ios_base((ios_base *)(local_4a8 + 0x68));
    puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)local_5d8,0,(char *)0x0,0x1c92647);
  }
  local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
  psVar9 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_610.field_2._M_allocated_capacity = *psVar9;
    local_610.field_2._8_8_ = puVar6[3];
  }
  else {
    local_610.field_2._M_allocated_capacity = *psVar9;
    local_610._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_610._M_string_length = puVar6[1];
  *puVar6 = psVar9;
  puVar6[1] = 0;
  *(undefined1 *)psVar9 = 0;
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_610,0,(char *)0x0,0x1c92c18);
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_5b8.field_2._M_allocated_capacity = *psVar9;
    local_5b8.field_2._8_8_ = plVar5[3];
    local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
  }
  else {
    local_5b8.field_2._M_allocated_capacity = *psVar9;
    local_5b8._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_5b8._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  __n = local_5f0;
  tcu::LogImage::LogImage
            ((LogImage *)local_1b0,(string *)local_330,&local_5b8,local_5f0,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_1b0,(int)local_5e0,__buf,(size_t)__n);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if (local_1b0 != (undefined1  [8])(local_1a8 + 8)) {
    operator_delete((void *)local_1b0,local_1a8._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._M_dataplus._M_p != &local_610.field_2) {
    operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1);
  }
  if (local_5d8[0] != local_5c8) {
    operator_delete(local_5d8[0],local_5c8[0] + 1);
  }
  if (local_330 != (undefined1  [8])local_320) {
    operator_delete((void *)local_330,local_320[0]._M_allocated_capacity + 1);
  }
  if (local_4f8 != local_4e8) {
    operator_delete(local_4f8,local_4e8[0] + 1);
  }
  iVar11 = (this->m_endResultImageLayerSize).m_data[1];
  bVar4 = iVar11 < 1;
  if (0 < iVar11) {
    iVar7 = iVar7 * sliceOrFaceNdx;
    local_5e4 = sliceOrFaceNdx * sliceOrFaceNdx;
    lVar12 = 0;
    do {
      if (0 < (this->m_endResultImageLayerSize).m_data[0]) {
        local_500 = lVar12 << 0x20;
        iVar11 = (int)lVar12;
        local_614 = iVar11 * iVar11 + local_5e4;
        iVar13 = 0;
        do {
          uStack_4c8 = 0;
          uStack_4c4 = 0;
          local_4e8[2] = 0;
          uStack_4d0 = 0;
          local_4cc = 0;
          local_4e8[0] = 0;
          local_4e8[1] = 0;
          local_4f8 = (long *)0x0;
          aiStack_4f0[0] = 0;
          aiStack_4f0[1] = 0;
          local_5b8.field_2._M_allocated_capacity = 0;
          local_5b8.field_2._8_8_ = 0;
          local_5b8._M_dataplus._M_p = (pointer)0x0;
          local_5b8._M_string_length = 0;
          local_598 = 0;
          piVar14 = aiStack_4f0;
          lVar10 = 0;
          do {
            y = (this->m_endResultImageLayerSize).m_data[0] * (int)lVar10 + iVar13;
            piVar14[-2] = y;
            piVar14[-1] = iVar11;
            *piVar14 = sliceOrFaceNdx;
            (&local_5b8._M_dataplus)[lVar10]._M_p = (pointer)(local_500 | y);
            if (bVar16) {
              tcu::ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)local_4b0,(int)local_5f0,y,iVar11);
              *(undefined4 *)(local_534 + lVar10 * 4) = local_4b0._0_4_;
              if (this->m_operation < ATOMIC_OPERATION_EXCHANGE) {
                iVar15 = y * y + local_614;
              }
              else {
                iVar15 = -1;
                if (this->m_operation == ATOMIC_OPERATION_EXCHANGE) {
                  iVar15 = (y + iVar7) * local_618 + iVar11;
                }
              }
              *(int *)(local_548 + lVar10 * 4) = iVar15;
            }
            else {
              tcu::ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)local_4b0,(int)local_5f0,y,iVar11);
              *(undefined4 *)(local_534 + lVar10 * 4) = local_4b0._0_4_;
              if (this->m_operation < ATOMIC_OPERATION_EXCHANGE) {
                iVar15 = y * y + local_614;
              }
              else {
                iVar15 = -1;
                if (this->m_operation == ATOMIC_OPERATION_EXCHANGE) {
                  iVar15 = (y + iVar7) * local_618 + iVar11;
                }
              }
              *(float *)(local_548 + lVar10 * 4) = (float)iVar15;
            }
            lVar10 = lVar10 + 1;
            piVar14 = piVar14 + 3;
          } while (lVar10 != 5);
          if (bVar16) {
            AVar2 = this->m_operation;
            iVar15 = -1;
            if ((ulong)AVar2 < 7) {
              iVar15 = *(int *)(&DAT_01c91b54 + (ulong)AVar2 * 4);
            }
            local_4b0 = (undefined1  [8])((ulong)(uint3)local_4b0._5_3_ << 0x28);
            bVar3 = verifyRecursive<int>
                              (AVar2,0,iVar15,(bool (*) [5])local_4b0,(int (*) [5])local_548,
                               (int (*) [5])local_534);
          }
          else {
            AVar2 = this->m_operation;
            valueSoFar = -1.0;
            if ((ulong)AVar2 < 7) {
              valueSoFar = *(float *)(&DAT_01c91b70 + (ulong)AVar2 * 4);
            }
            local_4b0 = (undefined1  [8])((ulong)(uint3)local_4b0._5_3_ << 0x28);
            bVar3 = verifyRecursive<float>
                              (AVar2,0,valueSoFar,(bool (*) [5])local_4b0,(float (*) [5])local_548,
                               (float (*) [5])local_534);
          }
          if (bVar3 == false) {
            local_330 = (undefined1  [8])local_5e0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_328,"// Failure: intermediate return values at pixels ",
                       0x31);
            arrayStr<tcu::Vector<int,2>,5>(&local_610,(Functional *)&local_5b8,arr);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_328,local_610._M_dataplus._M_p,local_610._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_328," of current layer are ",0x16);
            if (bVar16) {
              arrayStr<int,5>(&local_568,local_534,(int (*) [5])arr_00);
            }
            else {
              arrayStr<float,5>(&local_568,local_534,arr_00);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_328,local_568._M_dataplus._M_p,local_568._M_string_length);
            local_1b0 = (undefined1  [8])
                        tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_330,
                                   (EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"// Note: relevant shader invocation global IDs are ",
                       0x33);
            arrayStr<tcu::Vector<int,3>,5>(&local_520,(Functional *)&local_4f8,arr_01);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_520._M_dataplus._M_p,local_520._M_string_length);
            local_4b0 = (undefined1  [8])
                        tcu::MessageBuilder::operator<<
                                  ((MessageBuilder *)local_1b0,
                                   (EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4a8,"// Note: data expression values for the IDs are ",0x30)
            ;
            if (bVar16) {
              arrayStr<int,5>(&local_588,local_548,(int (*) [5])arr_02);
            }
            else {
              arrayStr<float,5>(&local_588,local_548,arr_02);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4a8,local_588._M_dataplus._M_p,local_588._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4a8,
                       "; return values are not a valid result for any order of operations",0x42);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_588._M_dataplus._M_p != &local_588.field_2) {
              operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4a8);
            std::ios_base::~ios_base(local_438);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_520._M_dataplus._M_p != &local_520.field_2) {
              operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_568._M_dataplus._M_p != &local_568.field_2) {
              operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_610._M_dataplus._M_p != &local_610.field_2) {
              operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
            std::ios_base::~ios_base(local_2b8);
            return bVar4;
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < (this->m_endResultImageLayerSize).m_data[0]);
      }
      lVar12 = lVar12 + 1;
      lVar10 = (long)(this->m_endResultImageLayerSize).m_data[1];
      bVar4 = lVar10 <= lVar12;
    } while (lVar12 < lVar10);
  }
  return bVar4;
}

Assistant:

bool operator() (TestLog& log, const ConstPixelBufferAccess& resultSlice, int sliceOrFaceNdx) const
	{
		const bool		isIntegerFormat		(isFormatTypeInteger(resultSlice.getFormat().type));
		const IVec2		dispatchSizeXY	(resultSlice.getWidth(), resultSlice.getHeight());

		DE_ASSERT(resultSlice.getWidth()	== NUM_INVOCATIONS_PER_PIXEL*m_endResultImageLayerSize.x()	&&
				  resultSlice.getHeight()	== m_endResultImageLayerSize.y()							&&
				  resultSlice.getDepth()	== 1);

		log << TestLog::Image("ReturnValues" + toString(sliceOrFaceNdx),
							  "Per-Invocation Return Values, "
								   + (m_imageType == TEXTURETYPE_CUBE ? "face " + string(glu::getCubeMapFaceName(cubeFaceToGLFace(glslImageFuncZToCubeFace(sliceOrFaceNdx))))
																	  : "slice " + toString(sliceOrFaceNdx)),
							  resultSlice);

		for (int y = 0; y < m_endResultImageLayerSize.y(); y++)
		for (int x = 0; x < m_endResultImageLayerSize.x(); x++)
		{
			union IntFloatArr
			{
				int		i[NUM_INVOCATIONS_PER_PIXEL];
				float	f[NUM_INVOCATIONS_PER_PIXEL];
			};

			// Get the atomic function args and return values for all the invocations that contribute to the pixel (x, y) in the current end result slice.

			IntFloatArr		returnValues;
			IntFloatArr		atomicArgs;
			IVec3			invocationGlobalIDs[NUM_INVOCATIONS_PER_PIXEL];
			IVec2			pixelCoords[NUM_INVOCATIONS_PER_PIXEL];

			for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
			{
				const IVec2 pixCoord	(x + i*m_endResultImageLayerSize.x(), y);
				const IVec3 gid			(pixCoord.x(), pixCoord.y(), sliceOrFaceNdx);

				invocationGlobalIDs[i]	= gid;
				pixelCoords[i]			= pixCoord;

				if (isIntegerFormat)
				{
					returnValues.i[i]	= resultSlice.getPixelInt(gid.x(), y).x();
					atomicArgs.i[i]		= getAtomicFuncArgument(m_operation, gid, dispatchSizeXY);
				}
				else
				{
					returnValues.f[i]	= resultSlice.getPixel(gid.x(), y).x();
					atomicArgs.f[i]		= (float)getAtomicFuncArgument(m_operation, gid, dispatchSizeXY);
				}
			}

			// Verify that the return values form a valid sequence.

			{
				const bool success = isIntegerFormat ? verifyOperationAccumulationIntermediateValues(m_operation,
																									 getOperationInitialValue(m_operation),
																									 atomicArgs.i,
																									 returnValues.i)

													 : verifyOperationAccumulationIntermediateValues(m_operation,
																									 (float)getOperationInitialValue(m_operation),
																									 atomicArgs.f,
																									 returnValues.f);

				if (!success)
				{
					log << TestLog::Message << "// Failure: intermediate return values at pixels " << arrayStr(pixelCoords) << " of current layer are "
											<< (isIntegerFormat ? arrayStr(returnValues.i) : arrayStr(returnValues.f)) << TestLog::EndMessage
						<< TestLog::Message << "// Note: relevant shader invocation global IDs are " << arrayStr(invocationGlobalIDs) << TestLog::EndMessage
						<< TestLog::Message << "// Note: data expression values for the IDs are "
											<< (isIntegerFormat ? arrayStr(atomicArgs.i) : arrayStr(atomicArgs.f))
											<< "; return values are not a valid result for any order of operations" << TestLog::EndMessage;
					return false;
				}
			}
		}

		return true;
	}